

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  long lVar1;
  long lVar2;
  uint isCreate_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  sqlite3_module *psVar6;
  size_t sVar7;
  char *pcVar8;
  Rtree *p;
  char *pcVar9;
  long in_RCX;
  int in_EDX;
  ulong uVar10;
  long in_RSI;
  sqlite3 *in_RDI;
  undefined8 *in_R8;
  Rtree *in_R9;
  long in_FS_OFFSET;
  char *zArg;
  int iErr;
  int ii;
  char *zSql;
  sqlite3_str *pSql;
  int eCoordType;
  int nName;
  int nDb;
  Rtree *pRtree;
  int rc;
  char *aErrMsg [5];
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Rtree *in_stack_ffffffffffffff30;
  sqlite3 *in_stack_ffffffffffffff38;
  Rtree *in_stack_ffffffffffffff40;
  int isCreate_01;
  Rtree *pRtree_00;
  sqlite3 *in_stack_ffffffffffffff50;
  uint local_a8;
  int local_a4;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff88;
  int local_3c;
  undefined8 local_38;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  isCreate_00 = (uint)(in_RSI != 0);
  memcpy(&local_38,&DAT_002e6460,0x28);
  if ((in_EDX < 6) || (0x67 < in_EDX)) {
    psVar6 = (sqlite3_module *)sqlite3_mprintf("%s",(&local_38)[(int)((5 < in_EDX) + 2)]);
    (in_R9->base).pModule = psVar6;
    local_3c = 1;
  }
  else {
    sqlite3_vtab_config(in_RDI,1);
    sqlite3_vtab_config(in_RDI);
    sVar7 = strlen(*(char **)(in_RCX + 8));
    iVar3 = (int)sVar7;
    sVar7 = strlen(*(char **)(in_RCX + 0x10));
    iVar4 = (int)sVar7;
    pcVar8 = (char *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
    ;
    if (pcVar8 == (char *)0x0) {
      local_3c = 7;
    }
    else {
      memset(pcVar8,0,(long)iVar3 + (long)(iVar4 << 1) + 0x3d0);
      pcVar8[0x48] = '\x01';
      pcVar8[0x49] = '\0';
      pcVar8[0x4a] = '\0';
      pcVar8[0x4b] = '\0';
      *(sqlite3_module **)pcVar8 = &rtreeModule;
      *(char **)(pcVar8 + 0x30) = pcVar8 + 0x3c8;
      *(long *)(pcVar8 + 0x38) = *(long *)(pcVar8 + 0x30) + (long)(iVar3 + 1);
      *(long *)(pcVar8 + 0x40) = *(long *)(pcVar8 + 0x38) + (long)(iVar4 + 1);
      pcVar8[0x26] = (char)isCreate_00;
      memcpy(*(void **)(pcVar8 + 0x30),*(void **)(in_RCX + 8),(long)iVar3);
      memcpy(*(void **)(pcVar8 + 0x38),*(void **)(in_RCX + 0x10),(long)iVar4);
      memcpy(*(void **)(pcVar8 + 0x40),*(void **)(in_RCX + 0x10),(long)iVar4);
      lVar2 = *(long *)(pcVar8 + 0x40);
      *(undefined4 *)(lVar2 + iVar4) = 0x646f6e5f;
      *(undefined2 *)(lVar2 + 4 + (long)iVar4) = 0x65;
      p = (Rtree *)sqlite3_str_new((sqlite3 *)in_stack_ffffffffffffff40);
      pRtree_00 = p;
      uVar5 = rtreeTokenLength((char *)in_stack_ffffffffffffff30);
      sqlite3_str_appendf((StrAccum *)pRtree_00,"CREATE TABLE x(%.*s INT",(ulong)uVar5,
                          *(undefined8 *)(in_RCX + 0x18));
      for (local_a4 = 4; isCreate_01 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
          local_a4 < in_EDX; local_a4 = local_a4 + 1) {
        in_stack_ffffffffffffff50 = *(sqlite3 **)(in_RCX + (long)local_a4 * 8);
        if (*(char *)&in_stack_ffffffffffffff50->pVfs == '+') {
          pcVar8[0x29] = pcVar8[0x29] + '\x01';
          in_stack_ffffffffffffff40 = p;
          uVar5 = rtreeTokenLength((char *)in_stack_ffffffffffffff30);
          sqlite3_str_appendf((StrAccum *)in_stack_ffffffffffffff40,",%.*s",(ulong)uVar5,
                              (undefined1 *)((long)&in_stack_ffffffffffffff50->pVfs + 1));
        }
        else {
          if (pcVar8[0x29] != '\0') break;
          pcVar8[0x25] = pcVar8[0x25] + '\x01';
          in_stack_ffffffffffffff38 = (sqlite3 *)rtreeInit::azFormat[(int)isCreate_00];
          in_stack_ffffffffffffff30 = p;
          uVar5 = rtreeTokenLength((char *)p);
          sqlite3_str_appendf((StrAccum *)in_stack_ffffffffffffff30,
                              (char *)in_stack_ffffffffffffff38,(ulong)uVar5,
                              in_stack_ffffffffffffff50);
        }
      }
      sqlite3_str_appendf((StrAccum *)p,");");
      pcVar9 = sqlite3_str_finish((sqlite3_str *)in_stack_ffffffffffffff30);
      if (pcVar9 == (char *)0x0) {
        local_3c = 7;
      }
      else if (local_a4 < in_EDX) {
        psVar6 = (sqlite3_module *)sqlite3_mprintf("%s",local_18);
        (in_R9->base).pModule = psVar6;
        local_3c = 1;
      }
      else {
        local_3c = sqlite3_declare_vtab
                             ((sqlite3 *)CONCAT44(iVar3,iVar4),
                              (char *)CONCAT44(isCreate_00,in_stack_ffffffffffffff70));
        if (local_3c != 0) {
          pcVar9 = sqlite3_errmsg(in_stack_ffffffffffffff38);
          psVar6 = (sqlite3_module *)sqlite3_mprintf("%s",pcVar9);
          (in_R9->base).pModule = psVar6;
        }
      }
      sqlite3_free((void *)0x299128);
      if (local_3c == 0) {
        uVar10 = (ulong)(byte)pcVar8[0x25] % 2;
        pcVar8[0x24] = (byte)pcVar8[0x25] / 2;
        if (pcVar8[0x24] == '\0') {
          local_a8 = 2;
        }
        else if ((byte)pcVar8[0x25] < 0xb) {
          uVar10 = (ulong)(byte)pcVar8[0x25] % 2;
          local_a8 = (uint)((int)uVar10 != 0);
        }
        else {
          local_a8 = 3;
        }
        if (local_a8 == 0) {
          pcVar8[0x27] = pcVar8[0x25] * '\x04' + '\b';
          local_3c = getNodeSize(in_stack_ffffffffffffff50,pRtree_00,isCreate_01,
                                 (char **)in_stack_ffffffffffffff38);
          if (local_3c == 0) {
            local_3c = rtreeSqlInit(in_R9,(sqlite3 *)(ulong)in_stack_ffffffffffffff88,pcVar8,
                                    (char *)CONCAT44(iVar3,iVar4),isCreate_00);
            if (local_3c == 0) {
              *in_R8 = pcVar8;
              local_3c = 0;
              goto LAB_002992c1;
            }
            pcVar8 = sqlite3_errmsg(in_stack_ffffffffffffff38);
            psVar6 = (sqlite3_module *)sqlite3_mprintf("%s",pcVar8);
            (in_R9->base).pModule = psVar6;
          }
        }
        else {
          psVar6 = (sqlite3_module *)sqlite3_mprintf("%s",(&local_38)[(int)local_a8],uVar10);
          (in_R9->base).pModule = psVar6;
        }
      }
      if (local_3c == 0) {
        local_3c = 1;
      }
      rtreeRelease((Rtree *)0x2992b6);
    }
  }
LAB_002992c1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc<6 || argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[2 + (argc>=6)]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
  sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);


  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName*2+8);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName*2+8);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->zNodeName = &pRtree->zName[nName+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);
  memcpy(pRtree->zNodeName, argv[2], nName);
  memcpy(&pRtree->zNodeName[nName], "_node", 6);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%.*s INT",
                      rtreeTokenLength(argv[3]), argv[3]);
  for(ii=4; ii<argc; ii++){
    const char *zArg = argv[ii];
    if( zArg[0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%.*s", rtreeTokenLength(zArg+1), zArg+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      static const char *azFormat[] = {",%.*s REAL", ",%.*s INT"};
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, azFormat[eCoordType],
                          rtreeTokenLength(zArg), zArg);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}